

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppjit.hpp
# Opt level: O0

void __thiscall
cppjit::kernel<bool,_cppjit::detail::pack<int>_>::set_builder
          (kernel<bool,_cppjit::detail::pack<int>_> *this,
          shared_ptr<cppjit::builder::builder> *builder_)

{
  bool bVar1;
  cppjit_exception *this_00;
  element_type *this_01;
  allocator local_39;
  string local_38 [32];
  shared_ptr<cppjit::builder::builder> *local_18;
  shared_ptr<cppjit::builder::builder> *builder__local;
  kernel<bool,_cppjit::detail::pack<int>_> *this_local;
  
  local_18 = builder_;
  builder__local = (shared_ptr<cppjit::builder::builder> *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->builder);
  if (!bVar1) {
    this_00 = (cppjit_exception *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"builder is invalid",&local_39);
    cppjit_exception::cppjit_exception(this_00,(string *)local_38);
    __cxa_throw(this_00,&cppjit_exception::typeinfo,cppjit_exception::~cppjit_exception);
  }
  this_01 = std::
            __shared_ptr_access<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<cppjit::builder::builder,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->builder);
  builder::builder::clear(this_01);
  std::shared_ptr<cppjit::builder::builder>::operator=(&this->builder,builder_);
  return;
}

Assistant:

void set_builder(std::shared_ptr<cppjit::builder::builder> builder_) {
    if (!builder) {
      throw cppjit::cppjit_exception("builder is invalid");
    }
    builder->clear();
    builder = builder_;
  }